

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecimalDatatypeValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DecimalDatatypeValidator::assignAdditionalFacet
          (DecimalDatatypeValidator *this,XMLCh *key,XMLCh *value,MemoryManager *manager)

{
  int *piVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  uint uVar4;
  XMLCh *pXVar5;
  InvalidDatatypeFacetException *this_00;
  XMLCh *pXVar6;
  
  if (key == L"totalDigits") {
LAB_002f7073:
    uVar4 = XMLString::parseInt(value,manager);
    if (0 < (int)uVar4) {
      this->fTotalDigits = uVar4;
      uVar4 = 0x200;
      goto LAB_002f70b1;
    }
    this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeFacetException::InvalidDatatypeFacetException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
               ,0x7e,FACET_PosInt_TotalDigit,value,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
    goto LAB_002f705d;
  }
  pXVar5 = L"totalDigits";
  pXVar6 = key;
  if (key == (XMLCh *)0x0) {
LAB_002f6fe3:
    if (*pXVar5 == L'\0') goto LAB_002f7073;
  }
  else {
    do {
      XVar2 = *pXVar6;
      if (XVar2 == L'\0') goto LAB_002f6fe3;
      XVar3 = *pXVar5;
      pXVar5 = pXVar5 + 1;
      pXVar6 = pXVar6 + 1;
    } while (XVar2 == XVar3);
  }
  if (key == L"fractionDigits") {
LAB_002f7096:
    uVar4 = XMLString::parseInt(value,manager);
    if (-1 < (int)uVar4) {
      this->fFractionDigits = uVar4;
      uVar4 = 0x400;
LAB_002f70b1:
      piVar1 = &(this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
                super_DatatypeValidator.fFacetsDefined;
      *piVar1 = *piVar1 | uVar4;
      return;
    }
    this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeFacetException::InvalidDatatypeFacetException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
               ,0x91,FACET_NonNeg_FractDigit,value,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
  }
  else {
    pXVar5 = L"fractionDigits";
    pXVar6 = key;
    if (key == (XMLCh *)0x0) {
LAB_002f7090:
      if (*pXVar5 == L'\0') goto LAB_002f7096;
    }
    else {
      do {
        XVar2 = *pXVar6;
        if (XVar2 == L'\0') goto LAB_002f7090;
        XVar3 = *pXVar5;
        pXVar5 = pXVar5 + 1;
        pXVar6 = pXVar6 + 1;
      } while (XVar2 == XVar3);
    }
    this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeFacetException::InvalidDatatypeFacetException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
               ,0x9b,FACET_Invalid_Tag,key,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
  }
LAB_002f705d:
  __cxa_throw(this_00,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
}

Assistant:

void DecimalDatatypeValidator::assignAdditionalFacet(const XMLCh* const key
                                                   , const XMLCh* const value
                                                   , MemoryManager* const manager)
{
    if (XMLString::equals(key, SchemaSymbols::fgELT_TOTALDIGITS))
    {
        int val;
        try
        {
            val = XMLString::parseInt(value, manager);
        }
        catch (NumberFormatException&)
        {
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_TotalDigit, value, manager);
        }

        // check 4.3.11.c0 must: totalDigits > 0
        if ( val <= 0 )
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_PosInt_TotalDigit, value, manager);

        setTotalDigits(val);
        setFacetsDefined(DatatypeValidator::FACET_TOTALDIGITS);
    }
    else if (XMLString::equals(key, SchemaSymbols::fgELT_FRACTIONDIGITS))
    {
        int val;
        try
        {
            val = XMLString::parseInt(value, manager);
        }
        catch (NumberFormatException&)
        {
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_FractDigit, value, manager);
        }

        // check 4.3.12.c0 must: fractionDigits > 0
        if ( val < 0 )
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_NonNeg_FractDigit, value, manager);

        setFractionDigits(val);
        setFacetsDefined(DatatypeValidator::FACET_FRACTIONDIGITS);
    }
    else
    {
        ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                , XMLExcepts::FACET_Invalid_Tag
                , key
                , manager);
    }
}